

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByName(Descriptor *this,string_view name)

{
  string_view name_00;
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *local_50;
  Symbol local_30;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  Descriptor *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Descriptor *)name._M_len;
  field = (FieldDescriptor *)this;
  pFVar2 = file(this);
  name_00._M_str = (char *)name_local._M_len;
  name_00._M_len = (size_t)this_local;
  local_30.ptr_ =
       (SymbolBase *)
       FileDescriptorTables::
       FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                 (pFVar2->tables_,this,name_00);
  local_28 = Symbol::field_descriptor(&local_30);
  if ((local_28 == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension(local_28), !bVar1)) {
    local_50 = (FieldDescriptor *)0x0;
  }
  else {
    local_50 = local_28;
  }
  return local_50;
}

Assistant:

const FieldDescriptor* Descriptor::FindExtensionByName(
    absl::string_view name) const {
  const FieldDescriptor* field =
      file()->tables_->FindNestedSymbol(this, name).field_descriptor();
  return field != nullptr && field->is_extension() ? field : nullptr;
}